

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayoutState::deleteAllLayoutItems(QMainWindowLayoutState *this)

{
  QDockAreaLayout *in_RDI;
  QToolBarAreaLayout *in_stack_00000030;
  
  QToolBarAreaLayout::deleteAllLayoutItems(in_stack_00000030);
  QDockAreaLayout::deleteAllLayoutItems(in_RDI);
  return;
}

Assistant:

void QMainWindowLayoutState::deleteAllLayoutItems()
{
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.deleteAllLayoutItems();
#endif

#if QT_CONFIG(dockwidget)
    dockAreaLayout.deleteAllLayoutItems();
#endif
}